

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.cpp
# Opt level: O0

void __thiscall ObjectIdentifier::SetValue(ObjectIdentifier *this,char *szOid)

{
  invalid_argument *this_00;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_80;
  const_iterator local_78;
  uchar *local_70;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_68;
  const_iterator local_60;
  size_t local_48;
  size_t cbUsed;
  uchar buf [8];
  char *next;
  unsigned_long second;
  unsigned_long first;
  char *tmp;
  char *szOid_local;
  ObjectIdentifier *this_local;
  
  tmp = szOid;
  szOid_local = (char *)this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->value);
  first = (unsigned_long)tmp;
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  local_48 = 0;
  GetNextLong(this,tmp,(char **)buf,&second);
  if ((buf != (uchar  [8])0x0) && (second < 3)) {
    first._0_1_ = buf[0];
    first._1_1_ = buf[1];
    first._2_1_ = buf[2];
    first._3_1_ = buf[3];
    first._4_1_ = buf[4];
    first._5_1_ = buf[5];
    first._6_1_ = buf[6];
    first._7_1_ = buf[7];
    GetNextLong(this,(char *)buf,(char **)buf,(unsigned_long *)&next);
    EncodeLong(this,(unsigned_long)(next + second * 0x28),(uchar *)&cbUsed,8,&local_48);
    local_68._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->value);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_60,&local_68);
    local_70 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                        insert<unsigned_char*,void>
                                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                                   &this->value,local_60,(uchar *)&cbUsed,buf + (local_48 - 8));
    while (buf != (uchar  [8])0x0) {
      first._0_1_ = buf[0];
      first._1_1_ = buf[1];
      first._2_1_ = buf[2];
      first._3_1_ = buf[3];
      first._4_1_ = buf[4];
      first._5_1_ = buf[5];
      first._6_1_ = buf[6];
      first._7_1_ = buf[7];
      GetNextLong(this,(char *)buf,(char **)buf,&second);
      EncodeLong(this,second,(uchar *)&cbUsed,8,&local_48);
      local_80._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&this->value);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_78,&local_80);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->value,local_78,
                 (uchar *)&cbUsed,buf + (local_48 - 8));
    }
    SetOidIndex(this);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Illegal OID");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void ObjectIdentifier::SetValue(const char * szOid)
{
	/*
	Current encoding practice is to multiply the first number by 40, then add the second.
	Practically, anything we care about with respect to crypto starts with 1.

	But let's try to make a general purpose library where we can, so there are the following:
	0, followed by 0-5 as possible values
	1, followed by 0-3
	2, followed by 0-51, with 999 used as an example

	We can then tell which of the three cases we have like so:
	0 - the value is < 40
	1 - value is < 80 and >= 40
	2 - value is >= 80

	*/
	value.clear();

	// This is going to require a substantial parser
	const char* tmp = szOid;
	unsigned long first, second;
	const char* next = nullptr;
	unsigned char buf[8];
	size_t cbUsed = 0;

	// The first two are special
	GetNextLong(tmp, next, first);

	if (next == nullptr || first > 2)
		throw std::invalid_argument("Illegal OID");

	tmp = next;
	GetNextLong(tmp, next, second);

	EncodeLong(first * 40 + second, buf, sizeof(buf), cbUsed);

	value.insert(value.begin(), buf, buf + cbUsed);

	// Now keep going to get the rest of the OID
	while (next != nullptr)
	{
		tmp = next;
		GetNextLong(tmp, next, first);
		EncodeLong(first, buf, sizeof(buf), cbUsed);
		value.insert(value.end(), buf, buf + cbUsed);
	}

    SetOidIndex();
}